

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O1

void __thiscall
AVSInterface::AVSInDelegator::Read
          (AVSInDelegator *this,char *name,vector<double,_std::allocator<double>_> *output)

{
  iterator __position;
  char cVar1;
  int iVar2;
  AVSValue *pAVar3;
  code *pcVar4;
  undefined8 *puVar5;
  int iVar6;
  long *plVar7;
  double dVar8;
  AVSValue arg;
  double local_48;
  AVSValue local_40;
  
  pAVar3 = &this->_args;
  iVar2 = NameToIndex(this,name);
  if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x508 < (uint)AVS_linkage->Size)) {
    pcVar4 = (code *)AVS_linkage->AVSValue_OPERATOR_INDEX;
    plVar7 = (long *)((long)&pAVar3->type + *(long *)&AVS_linkage->field_0x510);
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + *plVar7 + -1);
    }
    pAVar3 = (AVSValue *)(*pcVar4)(plVar7,iVar2);
  }
  if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x4d8 < (uint)AVS_linkage->Size)) {
    pcVar4 = (code *)AVS_linkage->AVSValue_CONSTRUCTOR9;
    plVar7 = (long *)((long)&local_40.type + *(long *)&AVS_linkage->field_0x4e0);
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + *plVar7 + -1);
    }
    (*pcVar4)(plVar7,pAVar3);
  }
  if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x578 < (uint)AVS_linkage->Size)) {
    pcVar4 = (code *)AVS_linkage->IsArray;
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + *(long *)((long)&local_40.type +
                                            *(long *)&AVS_linkage->field_0x580) + -1);
    }
    cVar1 = (*pcVar4)();
    if (cVar1 != '\0') {
      iVar2 = 0;
      if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x628 < (uint)AVS_linkage->Size)) {
        pcVar4 = (code *)AVS_linkage->ArraySize;
        if (((ulong)pcVar4 & 1) != 0) {
          pcVar4 = *(code **)(pcVar4 + *(long *)((long)&local_40.type +
                                                *(long *)&AVS_linkage->field_0x630) + -1);
        }
        iVar2 = (*pcVar4)();
      }
      if (*(long *)(output + 8) != *(long *)output) {
        *(long *)(output + 8) = *(long *)output;
      }
      if (0 < iVar2) {
        iVar6 = 0;
        do {
          pAVar3 = &local_40;
          if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x508 < (uint)AVS_linkage->Size)) {
            pcVar4 = (code *)AVS_linkage->AVSValue_OPERATOR_INDEX;
            plVar7 = (long *)((long)&local_40.type + *(long *)&AVS_linkage->field_0x510);
            if (((ulong)pcVar4 & 1) != 0) {
              pcVar4 = *(code **)(pcVar4 + *plVar7 + -1);
            }
            pAVar3 = (AVSValue *)(*pcVar4)(plVar7,iVar6);
          }
          dVar8 = 0.0;
          if ((AVS_linkage != (AVS_Linkage *)0x0) && (dVar8 = 0.0, 0x5c8 < (uint)AVS_linkage->Size))
          {
            pcVar4 = (code *)AVS_linkage->AsFloat1;
            plVar7 = (long *)((long)&pAVar3->type + *(long *)&AVS_linkage->field_0x5d0);
            if (((ulong)pcVar4 & 1) != 0) {
              pcVar4 = *(code **)(pcVar4 + *plVar7 + -1);
            }
            dVar8 = (double)(*pcVar4)(plVar7);
          }
          local_48 = dVar8;
          __position._M_current = *(double **)(output + 8);
          if (__position._M_current == *(double **)(output + 0x10)) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (output,__position,&local_48);
          }
          else {
            *__position._M_current = local_48;
            *(double **)(output + 8) = __position._M_current + 1;
          }
          iVar6 = iVar6 + 1;
        } while (iVar2 != iVar6);
      }
      AVSValue::~AVSValue(&local_40);
      return;
    }
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "Argument is not array";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

void Read(const char* name, std::vector<double>& output) override {
      auto arg = _args[NameToIndex(name)];
      if (!arg.IsArray())
        throw "Argument is not array";
      auto size = arg.ArraySize();
      output.clear();
      for (int i = 0; i < size; i++)
        output.push_back(arg[i].AsFloat());
    }